

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O1

void HTS_mc2b(double *mc,double *b,int m,double a)

{
  long lVar1;
  long lVar2;
  int iVar3;
  double dVar4;
  
  if (mc == b) {
    if (0 < m && a != 0.0) {
      dVar4 = b[(uint)m];
      lVar1 = (ulong)(uint)m + 1;
      do {
        dVar4 = dVar4 * -a + b[lVar1 + -2];
        b[lVar1 + -2] = dVar4;
        lVar1 = lVar1 + -1;
      } while (1 < lVar1);
    }
  }
  else if ((a != 0.0) || (NAN(a))) {
    b[m] = mc[m];
    if (0 < m) {
      dVar4 = b[(uint)m];
      lVar1 = (ulong)(uint)m + 1;
      do {
        dVar4 = dVar4 * -a + mc[lVar1 + -2];
        b[lVar1 + -2] = dVar4;
        lVar1 = lVar1 + -1;
      } while (1 < lVar1);
    }
  }
  else {
    iVar3 = m + 1;
    lVar1 = (long)iVar3;
    if (b < mc) {
      if (iVar3 != 0) {
        lVar2 = 0;
        do {
          b[lVar2] = mc[lVar2];
          lVar2 = lVar2 + 1;
        } while (lVar1 != lVar2);
      }
    }
    else if (iVar3 != 0) {
      do {
        b[lVar1 + -1] = mc[lVar1 + -1];
        lVar1 = lVar1 + -1;
      } while (lVar1 != 0);
    }
  }
  return;
}

Assistant:

static void HTS_mc2b(double *mc, double *b, int m, const double a)
{
   if (mc != b) {
      if (a != 0.0) {
         b[m] = mc[m];
         for (m--; m >= 0; m--)
            b[m] = mc[m] - a * b[m + 1];
      } else
         HTS_movem(mc, b, m + 1);
   } else if (a != 0.0)
      for (m--; m >= 0; m--)
         b[m] -= a * b[m + 1];
}